

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::FillerParameter::InternalSerializeWithCachedSizesToArray
          (FillerParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  string *psVar3;
  void *pvVar4;
  bool bVar5;
  byte *pbVar6;
  uint8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    psVar3 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.FillerParameter.type");
    psVar3 = (this->type_).ptr_;
    *target = '\n';
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar2 & 2) != 0) {
    fVar1 = this->value_;
    *target = 0x15;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 4) != 0) {
    fVar1 = this->min_;
    *target = 0x1d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 0x40) != 0) {
    fVar1 = this->max_;
    *target = 0x25;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 8) != 0) {
    fVar1 = this->mean_;
    *target = 0x2d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((char)uVar2 < '\0') {
    fVar1 = this->std_;
    *target = 0x35;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 0x20) != 0) {
    uVar8 = (ulong)this->sparse_;
    pbVar6 = target + 1;
    *target = 0x38;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  if ((uVar2 & 0x10) != 0) {
    uVar8 = (ulong)this->variance_norm_;
    pbVar6 = target + 1;
    *target = 0x40;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    puVar7 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
    return puVar7;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FillerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.FillerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string type = 1 [default = "constant"];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.FillerParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->type(), target);
  }

  // optional float value = 2 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->value(), target);
  }

  // optional float min = 3 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->min(), target);
  }

  // optional float max = 4 [default = 1];
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(4, this->max(), target);
  }

  // optional float mean = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(5, this->mean(), target);
  }

  // optional float std = 6 [default = 1];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(6, this->std(), target);
  }

  // optional int32 sparse = 7 [default = -1];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7, this->sparse(), target);
  }

  // optional .caffe.FillerParameter.VarianceNorm variance_norm = 8 [default = FAN_IN];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      8, this->variance_norm(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.FillerParameter)
  return target;
}